

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall deqp::gls::BuiltinPrecisionTests::Functions::Min::~Min(Min *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_PreciseFunc2).super_CFloatFunc2.super_FloatFunc2.
  super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  .
  super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  .super_FuncBase._vptr_FuncBase = (_func_int **)&PTR__CFloatFunc2_021bbe40;
  pcVar2 = (this->super_PreciseFunc2).super_CFloatFunc2.m_name._M_dataplus._M_p;
  paVar1 = &(this->super_PreciseFunc2).super_CFloatFunc2.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

Max (void) : PreciseFunc2("max", deMax) {}